

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack32_16(uint32_t *in,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  uVar1 = *(undefined8 *)(in + 2);
  uVar2 = *(undefined8 *)(in + 4);
  uVar3 = *(undefined8 *)(in + 6);
  uVar4 = *(undefined8 *)(in + 8);
  uVar5 = *(undefined8 *)(in + 10);
  uVar6 = *(undefined8 *)(in + 0xc);
  uVar7 = *(undefined8 *)(in + 0xe);
  *(undefined8 *)out = *(undefined8 *)in;
  *(undefined8 *)(out + 2) = uVar1;
  *(undefined8 *)(out + 4) = uVar2;
  *(undefined8 *)(out + 6) = uVar3;
  *(undefined8 *)(out + 8) = uVar4;
  *(undefined8 *)(out + 10) = uVar5;
  *(undefined8 *)(out + 0xc) = uVar6;
  *(undefined8 *)(out + 0xe) = uVar7;
  return in + 0x10;
}

Assistant:

const uint32_t *__fastunpack32_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;

  return in;
}